

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::SplitPath
               (string *p,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *components,bool expand_home_dir)

{
  char *__beg;
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  reference pcVar5;
  bool bVar6;
  allocator<char> local_111;
  value_type local_110;
  allocator<char> local_e9;
  value_type local_e8;
  char *local_c8;
  char *last;
  char *first;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0 [8];
  passwd *local_a8;
  passwd *pw;
  char *h;
  undefined1 local_78 [8];
  string homedir;
  undefined1 local_48 [8];
  string root;
  char *c;
  bool expand_home_dir_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *components_local;
  string *p_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(components);
  std::__cxx11::string::string((string *)local_48);
  root.field_2._8_8_ = SplitPathRootComponent(p,(string *)local_48);
  if (((expand_home_dir) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) &&
     (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar3 == '~')) {
    std::__cxx11::string::string((string *)local_78);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&h,(ulong)local_48);
    std::__cxx11::string::operator=((string *)local_48,(string *)&h);
    std::__cxx11::string::~string((string *)&h);
    lVar4 = std::__cxx11::string::size();
    if (lVar4 == 1) {
      pw = (passwd *)getenv("HOME");
      if (pw != (passwd *)0x0) {
        std::__cxx11::string::operator=((string *)local_78,(char *)pw);
      }
    }
    else {
      lVar4 = std::__cxx11::string::c_str();
      local_a8 = getpwnam((char *)(lVar4 + 1));
      if ((local_a8 != (passwd *)0x0) && (local_a8->pw_dir != (char *)0x0)) {
        std::__cxx11::string::operator=((string *)local_78,local_a8->pw_dir);
      }
    }
    uVar1 = std::__cxx11::string::empty();
    bVar6 = false;
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::rbegin();
      pcVar5 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(local_b0);
      bVar6 = true;
      if (*pcVar5 != '/') {
        std::__cxx11::string::rbegin();
        pcVar5 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&first);
        bVar6 = *pcVar5 == '\\';
      }
    }
    if (bVar6) {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)local_78);
    }
    SplitPath((string *)local_78,components,true);
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(components,(value_type *)local_48);
  }
  std::__cxx11::string::~string((string *)local_48);
  last = (char *)root.field_2._8_8_;
  for (local_c8 = (char *)root.field_2._8_8_; __beg = last, pcVar3 = local_c8, *local_c8 != '\0';
      local_c8 = local_c8 + 1) {
    if ((*local_c8 == '/') || (*local_c8 == '\\')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>((string *)&local_e8,__beg,pcVar3,&local_e9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(components,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      last = local_c8 + 1;
    }
  }
  if (local_c8 != (char *)root.field_2._8_8_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>((string *)&local_110,__beg,pcVar3,&local_111);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(components,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  return;
}

Assistant:

void SystemTools::SplitPath(const std::string& p,
                            std::vector<std::string>& components,
                            bool expand_home_dir)
{
  const char* c;
  components.clear();

  // Identify the root component.
  {
  std::string root;
  c = SystemTools::SplitPathRootComponent(p, &root);

  // Expand home directory references if requested.
  if(expand_home_dir && !root.empty() && root[0] == '~')
    {
    std::string homedir;
    root = root.substr(0, root.size()-1);
    if(root.size() == 1)
      {
#if defined(_WIN32) && !defined(__CYGWIN__)
      if(const char* userp = getenv("USERPROFILE"))
        {
        homedir = userp;
        }
      else
#endif
      if(const char* h = getenv("HOME"))
        {
        homedir = h;
        }
      }
#ifdef HAVE_GETPWNAM
    else if(passwd* pw = getpwnam(root.c_str()+1))
      {
      if(pw->pw_dir)
        {
        homedir = pw->pw_dir;
        }
      }
#endif
    if(!homedir.empty() && (*homedir.rbegin() == '/' ||
                            *homedir.rbegin() == '\\'))
      {
      homedir.resize(homedir.size() - 1);
      }
    SystemTools::SplitPath(homedir, components);
    }
  else
    {
    components.push_back(root);
    }
  }

  // Parse the remaining components.
  const char* first = c;
  const char* last = first;
  for(;*last; ++last)
    {
    if(*last == '/' || *last == '\\')
      {
      // End of a component.  Save it.
      components.push_back(std::string(first, last));
      first = last+1;
      }
    }

  // Save the last component unless there were no components.
  if(last != c)
    {
    components.push_back(std::string(first, last));
    }
}